

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O0

sexp_conflict
sexp_mutex_state(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict mutex)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint *in_RCX;
  undefined8 in_RSI;
  char *pcVar4;
  long in_RDI;
  sexp_conflict local_8;
  
  if ((((ulong)in_RCX & 3) == 0) &&
     (uVar1 = *(ulong *)(*(long *)(in_RDI + 0x28) + 0x1a0), auVar2._8_8_ = (long)uVar1 >> 0x3f,
     auVar2._0_8_ = uVar1 & 0xfffffffffffffffe, (ulong)*in_RCX == SUB168(auVar2 / SEXT816(2),0))) {
    if (*(long *)(in_RCX + 8) == 0x3e) {
      pcVar4 = "abandoned";
      if (*(long *)(in_RCX + 6) != 0) {
        pcVar4 = "not-abandoned";
      }
      local_8 = (sexp_conflict)sexp_intern(in_RDI,pcVar4,0xffffffffffffffff);
    }
    else if (((*(ulong *)(in_RCX + 6) & 3) == 0) && (**(int **)(in_RCX + 6) == 0x24)) {
      local_8 = *(sexp_conflict *)(in_RCX + 6);
    }
    else {
      local_8 = (sexp_conflict)sexp_intern(in_RDI,"not-owned",0xffffffffffffffff);
    }
  }
  else {
    uVar1 = *(ulong *)(*(long *)(in_RDI + 0x28) + 0x1a8);
    auVar3._8_8_ = (long)uVar1 >> 0x3f;
    auVar3._0_8_ = uVar1 & 0xfffffffffffffffe;
    local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,SUB168(auVar3 / SEXT816(2),0),in_RCX)
    ;
  }
  return local_8;
}

Assistant:

sexp sexp_mutex_state (sexp ctx, sexp self, sexp_sint_t n, sexp mutex) {
  if (!sexp_mutexp(ctx, mutex))
    return sexp_type_exception(ctx, self, sexp_unbox_fixnum(sexp_global(ctx, SEXP_G_THREADS_POLLFDS_ID)), mutex);
  if (sexp_truep(sexp_mutex_lockp(mutex))) {
    if (sexp_contextp(sexp_mutex_thread(mutex)))
      return sexp_mutex_thread(mutex);
    else
      return sexp_intern(ctx, "not-owned", -1);
  } else {
    return sexp_intern(ctx, (sexp_mutex_thread(mutex) ? "not-abandoned" : "abandoned"), -1);
  }
}